

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::ParserTester::case0622(ParserTester *this)

{
  string text;
  Expectation X;
  ParseOptions parseOpts;
  undefined1 *puVar1;
  undefined8 in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_ffffffffffffff20;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 auVar2 [32];
  undefined1 in_stack_ffffffffffffff38 [64];
  _Alloc_hider in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90 [16];
  pointer in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  _Vector_impl_data in_stack_ffffffffffffffb8;
  pointer local_28;
  pointer local_18;
  
  puVar1 = &stack0xffffffffffffff08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffef8,"typedef int x __attribute__ ( ( aligned ( 8 ) ));",
             "");
  Expectation::Expectation((Expectation *)&stack0xffffffffffffff38);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xffffffffffffff18);
  text._M_string_length = in_stack_ffffffffffffff20.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18;
  text.field_2._M_allocated_capacity = in_stack_ffffffffffffff28.BF_all_;
  text.field_2._8_8_ = in_stack_ffffffffffffff30;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff00;
  X._0_8_ = puVar1;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff08;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff10;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff18;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff20.BF_all_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff28.BF_all_;
  X._56_8_ = in_stack_ffffffffffffff30;
  auVar2 = in_stack_ffffffffffffff38._0_32_;
  X.ambiguityText_._M_dataplus._M_p = (pointer)auVar2._0_8_;
  X.ambiguityText_._M_string_length = auVar2._8_8_;
  X.ambiguityText_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  X.unfinishedParse_ = (bool)in_stack_ffffffffffffff38[0x20];
  X._97_7_ = in_stack_ffffffffffffff38._33_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_ffffffffffffff38._40_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff78._M_p;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff80;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff88;
  X.checkScope_ = (bool)in_stack_ffffffffffffff90[0];
  X._153_7_ = in_stack_ffffffffffffff90._1_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffff90._8_8_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffffa0;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffffa8;
  parseOpts._8_24_ = in_stack_ffffffffffffffb8;
  parseOpts._0_8_ = in_stack_ffffffffffffffb0;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffef8,parseOpts);
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28,(long)local_18 - (long)local_28);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector
            ((vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> *)&stack0xffffffffffffffb8);
  if (in_stack_ffffffffffffffa0 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffa0,
                    (long)in_stack_ffffffffffffffb0 - (long)in_stack_ffffffffffffffa0);
  }
  if (in_stack_ffffffffffffff78._M_p != &stack0xffffffffffffff88) {
    operator_delete(in_stack_ffffffffffffff78._M_p,in_stack_ffffffffffffff88 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff40);
  if (puVar1 != &stack0xffffffffffffff08) {
    operator_delete(puVar1,in_stack_ffffffffffffff08 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0622()
{
    parse("typedef int x __attribute__ ( ( aligned ( 8 ) ));") ;
}